

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  error_category *peVar3;
  char *pcVar4;
  error_category *peVar5;
  ostream *poVar6;
  error_category *extraout_RDX;
  error_category *extraout_RDX_00;
  error_condition local_a0;
  string local_90;
  undefined1 local_70 [8];
  error_code ec_1;
  error_condition local_50;
  string local_40;
  undefined1 local_20 [8];
  error_code ec;
  int retcode;
  
  ec._M_cat._4_4_ = 0;
  ec._M_cat._0_4_ = 0;
  peVar3 = ntkernel_error_category::ntkernel_category();
  std::error_code::error_code((error_code *)local_20,-0x3fffffc6,peVar3);
  std::error_code::message_abi_cxx11_(&local_40,(error_code *)local_20);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar4,"{Path Not Found}\nThe path %hs does not exist.");
  std::__cxx11::string::~string((string *)&local_40);
  if (iVar2 != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "!strcmp(ec.message().c_str(), \"{Path Not Found}\\nThe path %hs does not exist.\") failed at line "
                            );
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2f);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    ec._M_cat._0_4_ = 1;
  }
  local_50._M_value = std::error_code::default_error_condition();
  local_50._M_cat = extraout_RDX;
  peVar3 = std::error_condition::category(&local_50);
  peVar5 = (error_category *)std::_V2::generic_category();
  bVar1 = std::_V2::error_category::operator==(peVar3,peVar5);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "ec.default_error_condition().category() == std::generic_category() failed at line "
                            );
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x31);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    ec._M_cat._0_4_ = 1;
  }
  std::error_condition::error_condition<std::errc,void>
            ((error_condition *)&ec_1._M_cat,no_such_file_or_directory);
  bVar1 = std::operator==((error_code *)local_20,(error_condition *)&ec_1._M_cat);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "ec == std::errc::no_such_file_or_directory failed at line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x32);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    ec._M_cat._0_4_ = 1;
  }
  peVar3 = ntkernel_error_category::ntkernel_category();
  std::error_code::error_code((error_code *)local_70,-0x3fffffc5,peVar3);
  std::error_code::message_abi_cxx11_(&local_90,(error_code *)local_70);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar4,"Object Path Component was not a directory object.");
  std::__cxx11::string::~string((string *)&local_90);
  if (iVar2 != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "!strcmp(ec.message().c_str(), \"Object Path Component was not a directory object.\") failed at line "
                            );
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x3e);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    ec._M_cat._0_4_ = 1;
  }
  local_a0._M_value = std::error_code::default_error_condition();
  local_a0._M_cat = extraout_RDX_00;
  peVar3 = std::error_condition::category(&local_a0);
  peVar5 = ntkernel_error_category::ntkernel_category();
  bVar1 = std::_V2::error_category::operator==(peVar3,peVar5);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "ec.default_error_condition().category() == ntkernel_category() failed at line "
                            );
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x40);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    ec._M_cat._0_4_ = 1;
  }
  return (int)ec._M_cat;
}

Assistant:

int main()
{
  using namespace ntkernel_error_category;
  int retcode = 0;
  {
    std::error_code ec(static_cast<int>(0xc000003a), ntkernel_category());  // STATUS_OBJECT_PATH_NOT_FOUND
    CHECK(!strcmp(ec.message().c_str(), "{Path Not Found}\nThe path %hs does not exist."));
    // This is mapped to generic_category
    CHECK(ec.default_error_condition().category() == std::generic_category());
    CHECK(ec == std::errc::no_such_file_or_directory);
#ifdef _WIN32
    // Check we can compare to win32 error codes
    std::error_code winec(ERROR_PATH_NOT_FOUND, std::system_category());
    // Compare via mapping winec to generic_category and comparing generic_categories
    CHECK(ec == winec.default_error_condition());
    // Compare via mapping ec to generic_category and comparing generic_categories
    CHECK(ec.default_error_condition() == winec);
#endif
  }
  {
    std::error_code ec(static_cast<int>(0xc000003b), ntkernel_category());  // STATUS_OBJECT_PATH_SYNTAX_BAD
    CHECK(!strcmp(ec.message().c_str(), "Object Path Component was not a directory object."));
    // This has no mapping to generic_category
    CHECK(ec.default_error_condition().category() == ntkernel_category());
#ifdef _WIN32
    // Check we can compare to win32 error codes
    std::error_code winec(ERROR_BAD_PATHNAME, std::system_category());
    // Compare via ntkernel_category's special support for system_category
    CHECK(ec == winec.default_error_condition());
    // Compare via ntkernel_category's special support for system_category
    CHECK(ec.default_error_condition() == winec);
#endif
  }
  return retcode;
}